

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

bool SetPropertyCommand::HandleSourceFileDirectoryScopeValidation
               (cmExecutionStatus *status,bool source_file_directory_option_enabled,
               bool source_file_target_option_enabled,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *source_file_directories,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *source_file_target_directories)

{
  bool bVar1;
  allocator<char> local_89;
  undefined1 local_88 [8];
  string errors_1;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string errors;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *source_file_target_directories_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *source_file_directories_local;
  bool source_file_target_option_enabled_local;
  bool source_file_directory_option_enabled_local;
  cmExecutionStatus *status_local;
  
  errors.field_2._8_8_ = source_file_target_directories;
  if ((source_file_directory_option_enabled) &&
     (bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(source_file_directories), bVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,
               "called with incorrect number of arguments no value provided to the DIRECTORY option"
               ,&local_51);
    std::allocator<char>::~allocator(&local_51);
    cmExecutionStatus::SetError(status,(string *)local_50);
    status_local._7_1_ = false;
    std::__cxx11::string::~string((string *)local_50);
  }
  else if ((source_file_target_option_enabled) &&
          (bVar1 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)errors.field_2._8_8_), bVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_88,
               "called with incorrect number of arguments no value provided to the TARGET_DIRECTORY option"
               ,&local_89);
    std::allocator<char>::~allocator(&local_89);
    cmExecutionStatus::SetError(status,(string *)local_88);
    status_local._7_1_ = false;
    std::__cxx11::string::~string((string *)local_88);
  }
  else {
    status_local._7_1_ = true;
  }
  return status_local._7_1_;
}

Assistant:

bool HandleSourceFileDirectoryScopeValidation(
  cmExecutionStatus& status, bool source_file_directory_option_enabled,
  bool source_file_target_option_enabled,
  std::vector<std::string>& source_file_directories,
  std::vector<std::string>& source_file_target_directories)
{
  // Validate source file directory scopes.
  if (source_file_directory_option_enabled &&
      source_file_directories.empty()) {
    std::string errors = "called with incorrect number of arguments "
                         "no value provided to the DIRECTORY option";
    status.SetError(errors);
    return false;
  }
  if (source_file_target_option_enabled &&
      source_file_target_directories.empty()) {
    std::string errors = "called with incorrect number of arguments "
                         "no value provided to the TARGET_DIRECTORY option";
    status.SetError(errors);
    return false;
  }
  return true;
}